

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.h
# Opt level: O0

cmCommand * __thiscall cmOutputRequiredFilesCommand::Clone(cmOutputRequiredFilesCommand *this)

{
  cmOutputRequiredFilesCommand *this_00;
  cmOutputRequiredFilesCommand *this_local;
  
  this_00 = (cmOutputRequiredFilesCommand *)operator_new(0x70);
  cmOutputRequiredFilesCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmOutputRequiredFilesCommand; }